

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O0

void __thiscall
cmComputeLinkInformation::GetRPath
          (cmComputeLinkInformation *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *runtimeDirs,bool for_install)

{
  cmMakefile *pcVar1;
  cmGeneratorTarget *pcVar2;
  bool bVar3;
  char *pcVar4;
  ulong uVar5;
  long lVar6;
  reference pbVar7;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar8;
  byte local_5da;
  bool local_4d5;
  byte local_4d4;
  byte local_4d3;
  bool local_4bb;
  byte local_4ba;
  char *dirs;
  undefined1 local_478 [8];
  string dirVar;
  undefined1 local_438 [8];
  string useVar;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_410;
  const_iterator li;
  LinkClosure *lc;
  string local_3e0 [8];
  string suffix_1;
  undefined1 local_3a0 [8];
  string d_1;
  string local_378;
  byte local_353;
  byte local_352;
  allocator local_351;
  string local_350;
  byte local_32b;
  byte local_32a;
  allocator local_329;
  string local_328;
  allocator local_301;
  string local_300;
  char *local_2e0;
  char *topBinaryDir;
  char *topSourceDir;
  undefined1 local_2c8;
  _Base_ptr local_2c0;
  undefined1 local_2b8;
  string local_2b0 [8];
  string suffix;
  undefined1 local_270 [8];
  string d;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_248;
  const_iterator ri;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *rdirs;
  string local_230;
  char *local_210;
  char *installPrefix;
  string local_200;
  char *local_1e0;
  char *stagePath;
  string local_1d0;
  allocator local_1a9;
  string local_1a8;
  char *local_188;
  char *sysrootLink;
  string rootPath;
  string local_158;
  char *local_138;
  char *build_rpath;
  string local_128;
  char *local_108;
  char *install_rpath;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  emitted;
  string local_c8;
  byte local_a3;
  byte local_a2;
  allocator local_a1;
  string local_a0;
  byte local_7e;
  byte local_7d;
  byte local_7c;
  byte local_7b;
  byte local_7a;
  allocator local_79;
  undefined1 local_78 [2];
  bool use_link_rpath;
  bool use_build_rpath;
  bool use_install_rpath;
  byte local_55;
  bool linking_for_install;
  allocator local_41;
  string local_40;
  byte local_1a;
  byte local_19;
  bool outputRuntime;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvStack_18;
  bool for_install_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *runtimeDirs_local;
  cmComputeLinkInformation *this_local;
  
  pcVar1 = this->Makefile;
  local_19 = for_install;
  pvStack_18 = runtimeDirs;
  runtimeDirs_local =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_40,"CMAKE_SKIP_RPATH",&local_41);
  bVar3 = cmMakefile::IsOn(pcVar1,&local_40);
  local_4ba = 0;
  if (!bVar3) {
    local_4ba = std::__cxx11::string::empty();
    local_4ba = local_4ba ^ 0xff;
  }
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  local_1a = local_4ba & 1;
  local_7a = 0;
  local_7b = 0;
  local_4bb = true;
  if ((local_19 & 1) == 0) {
    pcVar2 = this->Target;
    std::allocator<char>::allocator();
    local_7a = 1;
    std::__cxx11::string::string((string *)local_78,"BUILD_WITH_INSTALL_RPATH",&local_79);
    local_7b = 1;
    local_4bb = cmGeneratorTarget::GetPropertyAsBool(pcVar2,(string *)local_78);
  }
  if ((local_7b & 1) != 0) {
    std::__cxx11::string::~string((string *)local_78);
  }
  if ((local_7a & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_79);
  }
  local_55 = local_4bb;
  local_4d3 = 0;
  if ((local_1a & 1) != 0) {
    bVar3 = cmGeneratorTarget::HaveInstallTreeRPATH(this->Target);
    local_4d3 = 0;
    if (bVar3) {
      local_4d3 = local_55;
    }
  }
  local_7c = local_4d3 & 1;
  local_4d4 = 0;
  if ((local_1a & 1) != 0) {
    bVar3 = cmGeneratorTarget::HaveBuildTreeRPATH(this->Target,&this->Config);
    local_4d4 = 0;
    if (bVar3) {
      local_4d4 = local_55 ^ 0xff;
    }
  }
  local_7d = local_4d4 & 1;
  local_a2 = 0;
  local_a3 = 0;
  emitted._M_t._M_impl.super__Rb_tree_header._M_node_count._6_1_ = 0;
  emitted._M_t._M_impl.super__Rb_tree_header._M_node_count._5_1_ = 0;
  local_4d5 = false;
  if (((local_1a & 1) != 0) && (local_4d5 = false, (local_55 & 1) != 0)) {
    pcVar1 = this->Makefile;
    std::allocator<char>::allocator();
    local_a2 = 1;
    std::__cxx11::string::string((string *)&local_a0,"CMAKE_SKIP_INSTALL_RPATH",&local_a1);
    local_a3 = 1;
    bVar3 = cmMakefile::IsOn(pcVar1,&local_a0);
    local_4d5 = false;
    if (!bVar3) {
      pcVar2 = this->Target;
      std::allocator<char>::allocator();
      emitted._M_t._M_impl.super__Rb_tree_header._M_node_count._6_1_ = 1;
      std::__cxx11::string::string
                ((string *)&local_c8,"INSTALL_RPATH_USE_LINK_PATH",
                 (allocator *)((long)&emitted._M_t._M_impl.super__Rb_tree_header._M_node_count + 7))
      ;
      emitted._M_t._M_impl.super__Rb_tree_header._M_node_count._5_1_ = 1;
      local_4d5 = cmGeneratorTarget::GetPropertyAsBool(pcVar2,&local_c8);
    }
  }
  if ((emitted._M_t._M_impl.super__Rb_tree_header._M_node_count._5_1_ & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_c8);
  }
  if ((emitted._M_t._M_impl.super__Rb_tree_header._M_node_count._6_1_ & 1) != 0) {
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&emitted._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
  }
  if ((local_a3 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_a0);
  }
  if ((local_a2 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  }
  local_7e = local_4d5;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)&install_rpath);
  if ((local_7c & 1) != 0) {
    pcVar2 = this->Target;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_128,"INSTALL_RPATH",(allocator *)((long)&build_rpath + 7));
    pcVar4 = cmGeneratorTarget::GetProperty(pcVar2,&local_128);
    std::__cxx11::string::~string((string *)&local_128);
    std::allocator<char>::~allocator((allocator<char> *)((long)&build_rpath + 7));
    local_108 = pcVar4;
    cmCLI_ExpandListUnique
              (pcVar4,pvStack_18,
               (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&install_rpath);
  }
  if ((local_7d & 1) != 0) {
    pcVar2 = this->Target;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_158,"BUILD_RPATH",(allocator *)(rootPath.field_2._M_local_buf + 0xf)
              );
    pcVar4 = cmGeneratorTarget::GetProperty(pcVar2,&local_158);
    std::__cxx11::string::~string((string *)&local_158);
    std::allocator<char>::~allocator((allocator<char> *)(rootPath.field_2._M_local_buf + 0xf));
    local_138 = pcVar4;
    if (pcVar4 != (char *)0x0) {
      cmCLI_ExpandListUnique
                (pcVar4,pvStack_18,
                 (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&install_rpath);
    }
  }
  if (((local_7d & 1) != 0) || ((local_7e & 1) != 0)) {
    std::__cxx11::string::string((string *)&sysrootLink);
    pcVar1 = this->Makefile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_1a8,"CMAKE_SYSROOT_LINK",&local_1a9);
    pcVar4 = cmMakefile::GetDefinition(pcVar1,&local_1a8);
    std::__cxx11::string::~string((string *)&local_1a8);
    std::allocator<char>::~allocator((allocator<char> *)&local_1a9);
    local_188 = pcVar4;
    if (pcVar4 == (char *)0x0) {
      pcVar1 = this->Makefile;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_1d0,"CMAKE_SYSROOT",(allocator *)((long)&stagePath + 7));
      pcVar4 = cmMakefile::GetSafeDefinition(pcVar1,&local_1d0);
      std::__cxx11::string::operator=((string *)&sysrootLink,pcVar4);
      std::__cxx11::string::~string((string *)&local_1d0);
      std::allocator<char>::~allocator((allocator<char> *)((long)&stagePath + 7));
    }
    else {
      std::__cxx11::string::operator=((string *)&sysrootLink,pcVar4);
    }
    pcVar1 = this->Makefile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_200,"CMAKE_STAGING_PREFIX",(allocator *)((long)&installPrefix + 7));
    pcVar4 = cmMakefile::GetDefinition(pcVar1,&local_200);
    std::__cxx11::string::~string((string *)&local_200);
    std::allocator<char>::~allocator((allocator<char> *)((long)&installPrefix + 7));
    pcVar1 = this->Makefile;
    local_1e0 = pcVar4;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_230,"CMAKE_INSTALL_PREFIX",(allocator *)((long)&rdirs + 7));
    pcVar4 = cmMakefile::GetSafeDefinition(pcVar1,&local_230);
    std::__cxx11::string::~string((string *)&local_230);
    std::allocator<char>::~allocator((allocator<char> *)((long)&rdirs + 7));
    local_210 = pcVar4;
    cmsys::SystemTools::ConvertToUnixSlashes((string *)&sysrootLink);
    ri._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         GetRuntimeSearchPath_abi_cxx11_(this);
    local_248._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)ri._M_current);
    while( true ) {
      d.field_2._8_8_ =
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)ri._M_current);
      bVar3 = __gnu_cxx::operator!=
                        (&local_248,
                         (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)((long)&d.field_2 + 8));
      if (!bVar3) break;
      if ((local_7d & 1) == 0) {
        if ((local_7e & 1) != 0) {
          topBinaryDir = cmake::GetHomeDirectory(this->CMakeInstance);
          local_2e0 = cmake::GetHomeOutputDirectory(this->CMakeInstance);
          pbVar7 = __gnu_cxx::
                   __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator*(&local_248);
          pcVar4 = topBinaryDir;
          std::allocator<char>::allocator();
          local_32a = 0;
          local_32b = 0;
          local_352 = 0;
          local_353 = 0;
          d_1.field_2._M_local_buf[0xe] = '\0';
          d_1.field_2._M_local_buf[0xd] = '\0';
          std::__cxx11::string::string((string *)&local_300,pcVar4,&local_301);
          bVar3 = cmsys::SystemTools::ComparePath(pbVar7,&local_300);
          local_5da = 0;
          if (!bVar3) {
            pbVar7 = __gnu_cxx::
                     __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator*(&local_248);
            pcVar4 = local_2e0;
            std::allocator<char>::allocator();
            local_32a = 1;
            std::__cxx11::string::string((string *)&local_328,pcVar4,&local_329);
            local_32b = 1;
            bVar3 = cmsys::SystemTools::ComparePath(pbVar7,&local_328);
            local_5da = 0;
            if (!bVar3) {
              pbVar7 = __gnu_cxx::
                       __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ::operator*(&local_248);
              pcVar4 = topBinaryDir;
              std::allocator<char>::allocator();
              local_352 = 1;
              std::__cxx11::string::string((string *)&local_350,pcVar4,&local_351);
              local_353 = 1;
              bVar3 = cmsys::SystemTools::IsSubDirectory(pbVar7,&local_350);
              local_5da = 0;
              if (!bVar3) {
                pbVar7 = __gnu_cxx::
                         __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         ::operator*(&local_248);
                pcVar4 = local_2e0;
                std::allocator<char>::allocator();
                d_1.field_2._M_local_buf[0xe] = '\x01';
                std::__cxx11::string::string
                          ((string *)&local_378,pcVar4,(allocator *)(d_1.field_2._M_local_buf + 0xf)
                          );
                d_1.field_2._M_local_buf[0xd] = '\x01';
                bVar3 = cmsys::SystemTools::IsSubDirectory(pbVar7,&local_378);
                local_5da = bVar3 ^ 0xff;
              }
            }
          }
          if ((d_1.field_2._M_local_buf[0xd] & 1U) != 0) {
            std::__cxx11::string::~string((string *)&local_378);
          }
          if ((d_1.field_2._M_local_buf[0xe] & 1U) != 0) {
            std::allocator<char>::~allocator((allocator<char> *)(d_1.field_2._M_local_buf + 0xf));
          }
          if ((local_353 & 1) != 0) {
            std::__cxx11::string::~string((string *)&local_350);
          }
          if ((local_352 & 1) != 0) {
            std::allocator<char>::~allocator((allocator<char> *)&local_351);
          }
          if ((local_32b & 1) != 0) {
            std::__cxx11::string::~string((string *)&local_328);
          }
          if ((local_32a & 1) != 0) {
            std::allocator<char>::~allocator((allocator<char> *)&local_329);
          }
          std::__cxx11::string::~string((string *)&local_300);
          std::allocator<char>::~allocator((allocator<char> *)&local_301);
          if ((local_5da & 1) != 0) {
            pbVar7 = __gnu_cxx::
                     __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator*(&local_248);
            std::__cxx11::string::string((string *)local_3a0,(string *)pbVar7);
            uVar5 = std::__cxx11::string::empty();
            if (((uVar5 & 1) == 0) &&
               (lVar6 = std::__cxx11::string::find((string *)local_3a0,(ulong)&sysrootLink),
               lVar6 == 0)) {
              std::__cxx11::string::size();
              std::__cxx11::string::substr((ulong)((long)&suffix_1.field_2 + 8),(ulong)local_3a0);
              std::__cxx11::string::operator=
                        ((string *)local_3a0,(string *)(suffix_1.field_2._M_local_buf + 8));
              std::__cxx11::string::~string((string *)(suffix_1.field_2._M_local_buf + 8));
            }
            else if ((local_1e0 != (char *)0x0) &&
                    ((*local_1e0 != '\0' &&
                     (lVar6 = std::__cxx11::string::find(local_3a0,(ulong)local_1e0), lVar6 == 0))))
            {
              strlen(local_1e0);
              std::__cxx11::string::substr((ulong)local_3e0,(ulong)local_3a0);
              std::__cxx11::string::operator=((string *)local_3a0,local_210);
              std::__cxx11::string::operator+=((string *)local_3a0,"/");
              std::__cxx11::string::operator+=((string *)local_3a0,local_3e0);
              cmsys::SystemTools::ConvertToUnixSlashes((string *)local_3a0);
              std::__cxx11::string::~string(local_3e0);
            }
            pVar8 = std::
                    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)&install_rpath,(value_type *)local_3a0);
            if (((undefined1  [16])pVar8 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back(pvStack_18,(value_type *)local_3a0);
            }
            std::__cxx11::string::~string((string *)local_3a0);
          }
        }
      }
      else {
        pbVar7 = __gnu_cxx::
                 __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&local_248);
        std::__cxx11::string::string((string *)local_270,(string *)pbVar7);
        uVar5 = std::__cxx11::string::empty();
        if (((uVar5 & 1) == 0) &&
           (lVar6 = std::__cxx11::string::find((string *)local_270,(ulong)&sysrootLink), lVar6 == 0)
           ) {
          std::__cxx11::string::size();
          std::__cxx11::string::substr((ulong)((long)&suffix.field_2 + 8),(ulong)local_270);
          std::__cxx11::string::operator=
                    ((string *)local_270,(string *)(suffix.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)(suffix.field_2._M_local_buf + 8));
        }
        else if ((local_1e0 != (char *)0x0) &&
                ((*local_1e0 != '\0' &&
                 (lVar6 = std::__cxx11::string::find(local_270,(ulong)local_1e0), lVar6 == 0)))) {
          strlen(local_1e0);
          std::__cxx11::string::substr((ulong)local_2b0,(ulong)local_270);
          std::__cxx11::string::operator=((string *)local_270,local_210);
          std::__cxx11::string::operator+=((string *)local_270,"/");
          std::__cxx11::string::operator+=((string *)local_270,local_2b0);
          cmsys::SystemTools::ConvertToUnixSlashes((string *)local_270);
          std::__cxx11::string::~string(local_2b0);
        }
        pVar8 = std::
                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&install_rpath,(value_type *)local_270);
        topSourceDir = (char *)pVar8.first._M_node;
        local_2c8 = pVar8.second;
        local_2c0 = (_Base_ptr)topSourceDir;
        local_2b8 = local_2c8;
        if (((undefined1  [16])pVar8 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(pvStack_18,(value_type *)local_270);
        }
        std::__cxx11::string::~string((string *)local_270);
      }
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_248);
    }
    std::__cxx11::string::~string((string *)&sysrootLink);
  }
  li._M_current = &cmGeneratorTarget::GetLinkClosure(this->Target,&this->Config)->LinkerLanguage;
  local_410._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin(&((LinkClosure *)li._M_current)->Languages);
  while( true ) {
    useVar.field_2._8_8_ =
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)(li._M_current + 1));
    bVar3 = __gnu_cxx::operator!=
                      (&local_410,
                       (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)((long)&useVar.field_2 + 8));
    if (!bVar3) break;
    pbVar7 = __gnu_cxx::
             __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&local_410);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&dirVar.field_2 + 8),"CMAKE_",pbVar7);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_438,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&dirVar.field_2 + 8),"_USE_IMPLICIT_LINK_DIRECTORIES_IN_RUNTIME_PATH");
    std::__cxx11::string::~string((string *)(dirVar.field_2._M_local_buf + 8));
    bVar3 = cmMakefile::IsOn(this->Makefile,(string *)local_438);
    if (bVar3) {
      pbVar7 = __gnu_cxx::
               __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&local_410);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&dirs,
                     "CMAKE_",pbVar7);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_478,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&dirs,
                     "_IMPLICIT_LINK_DIRECTORIES");
      std::__cxx11::string::~string((string *)&dirs);
      pcVar4 = cmMakefile::GetDefinition(this->Makefile,(string *)local_478);
      if (pcVar4 != (char *)0x0) {
        cmCLI_ExpandListUnique
                  (pcVar4,pvStack_18,
                   (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&install_rpath);
      }
      std::__cxx11::string::~string((string *)local_478);
    }
    std::__cxx11::string::~string((string *)local_438);
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&local_410);
  }
  pcVar4 = (char *)std::__cxx11::string::c_str();
  cmCLI_ExpandListUnique
            (pcVar4,pvStack_18,
             (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&install_rpath);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)&install_rpath);
  return;
}

Assistant:

void cmComputeLinkInformation::GetRPath(std::vector<std::string>& runtimeDirs,
                                        bool for_install)
{
  // Select whether to generate runtime search directories.
  bool outputRuntime =
    !this->Makefile->IsOn("CMAKE_SKIP_RPATH") && !this->RuntimeFlag.empty();

  // Select whether to generate an rpath for the install tree or the
  // build tree.
  bool linking_for_install =
    (for_install ||
     this->Target->GetPropertyAsBool("BUILD_WITH_INSTALL_RPATH"));
  bool use_install_rpath =
    (outputRuntime && this->Target->HaveInstallTreeRPATH() &&
     linking_for_install);
  bool use_build_rpath =
    (outputRuntime && this->Target->HaveBuildTreeRPATH(this->Config) &&
     !linking_for_install);
  bool use_link_rpath = outputRuntime && linking_for_install &&
    !this->Makefile->IsOn("CMAKE_SKIP_INSTALL_RPATH") &&
    this->Target->GetPropertyAsBool("INSTALL_RPATH_USE_LINK_PATH");

  // Construct the RPATH.
  std::set<std::string> emitted;
  if (use_install_rpath) {
    const char* install_rpath = this->Target->GetProperty("INSTALL_RPATH");
    cmCLI_ExpandListUnique(install_rpath, runtimeDirs, emitted);
  }
  if (use_build_rpath) {
    // Add directories explicitly specified by user
    if (const char* build_rpath = this->Target->GetProperty("BUILD_RPATH")) {
      cmCLI_ExpandListUnique(build_rpath, runtimeDirs, emitted);
    }
  }
  if (use_build_rpath || use_link_rpath) {
    std::string rootPath;
    if (const char* sysrootLink =
          this->Makefile->GetDefinition("CMAKE_SYSROOT_LINK")) {
      rootPath = sysrootLink;
    } else {
      rootPath = this->Makefile->GetSafeDefinition("CMAKE_SYSROOT");
    }
    const char* stagePath =
      this->Makefile->GetDefinition("CMAKE_STAGING_PREFIX");
    const char* installPrefix =
      this->Makefile->GetSafeDefinition("CMAKE_INSTALL_PREFIX");
    cmSystemTools::ConvertToUnixSlashes(rootPath);
    std::vector<std::string> const& rdirs = this->GetRuntimeSearchPath();
    for (std::vector<std::string>::const_iterator ri = rdirs.begin();
         ri != rdirs.end(); ++ri) {
      // Put this directory in the rpath if using build-tree rpath
      // support or if using the link path as an rpath.
      if (use_build_rpath) {
        std::string d = *ri;
        if (!rootPath.empty() && d.find(rootPath) == 0) {
          d = d.substr(rootPath.size());
        } else if (stagePath && *stagePath && d.find(stagePath) == 0) {
          std::string suffix = d.substr(strlen(stagePath));
          d = installPrefix;
          d += "/";
          d += suffix;
          cmSystemTools::ConvertToUnixSlashes(d);
        }
        if (emitted.insert(d).second) {
          runtimeDirs.push_back(d);
        }
      } else if (use_link_rpath) {
        // Do not add any path inside the source or build tree.
        const char* topSourceDir = this->CMakeInstance->GetHomeDirectory();
        const char* topBinaryDir =
          this->CMakeInstance->GetHomeOutputDirectory();
        if (!cmSystemTools::ComparePath(*ri, topSourceDir) &&
            !cmSystemTools::ComparePath(*ri, topBinaryDir) &&
            !cmSystemTools::IsSubDirectory(*ri, topSourceDir) &&
            !cmSystemTools::IsSubDirectory(*ri, topBinaryDir)) {
          std::string d = *ri;
          if (!rootPath.empty() && d.find(rootPath) == 0) {
            d = d.substr(rootPath.size());
          } else if (stagePath && *stagePath && d.find(stagePath) == 0) {
            std::string suffix = d.substr(strlen(stagePath));
            d = installPrefix;
            d += "/";
            d += suffix;
            cmSystemTools::ConvertToUnixSlashes(d);
          }
          if (emitted.insert(d).second) {
            runtimeDirs.push_back(d);
          }
        }
      }
    }
  }

  // Add runtime paths required by the languages to always be
  // present.  This is done even when skipping rpath support.
  {
    cmGeneratorTarget::LinkClosure const* lc =
      this->Target->GetLinkClosure(this->Config);
    for (std::vector<std::string>::const_iterator li = lc->Languages.begin();
         li != lc->Languages.end(); ++li) {
      std::string useVar =
        "CMAKE_" + *li + "_USE_IMPLICIT_LINK_DIRECTORIES_IN_RUNTIME_PATH";
      if (this->Makefile->IsOn(useVar)) {
        std::string dirVar = "CMAKE_" + *li + "_IMPLICIT_LINK_DIRECTORIES";
        if (const char* dirs = this->Makefile->GetDefinition(dirVar)) {
          cmCLI_ExpandListUnique(dirs, runtimeDirs, emitted);
        }
      }
    }
  }

  // Add runtime paths required by the platform to always be
  // present.  This is done even when skipping rpath support.
  cmCLI_ExpandListUnique(this->RuntimeAlways.c_str(), runtimeDirs, emitted);
}